

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::operator()(Builder *this,ReturnStmt *node)

{
  BuilderContext *this_00;
  BuilderContext *id;
  bool bVar1;
  element_type *node_00;
  ASTNode *this_01;
  undefined1 local_28 [24];
  ReturnStmt *node_local;
  Builder *this_local;
  
  local_28._16_8_ = node;
  node_local = (ReturnStmt *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->expr);
  if (bVar1) {
    node_00 = std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&((_List_node_base *)(local_28._16_8_ + 0x10))->_M_prev);
    visit<mocker::ast::Expression>(this,node_00);
  }
  this_00 = this->ctx;
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&((_List_node_base *)(local_28._16_8_ + 0x10))->_M_prev);
  if (bVar1) {
    id = this->ctx;
    this_01 = &std::
               __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&((_List_node_base *)(local_28._16_8_ + 0x10))->_M_prev)->
               super_ASTNode;
    ast::ASTNode::getID(this_01);
    BuilderContext::getExprAddr((BuilderContext *)local_28,(NodeID)id);
  }
  else {
    std::shared_ptr<mocker::ir::Addr>::shared_ptr
              ((shared_ptr<mocker::ir::Addr> *)local_28,(nullptr_t)0x0);
  }
  BuilderContext::emplaceInst<mocker::ir::Ret,std::shared_ptr<mocker::ir::Addr>>
            (this_00,(shared_ptr<mocker::ir::Addr> *)local_28);
  std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_28);
  return;
}

Assistant:

void Builder::operator()(const ast::ReturnStmt &node) const {
  if (node.expr)
    visit(*node.expr);
  ctx.emplaceInst<Ret>(node.expr ? ctx.getExprAddr(node.expr->getID())
                                 : nullptr);
}